

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O0

UnicodeString *
icu_63::NumeratorSubstitution::fixdesc(UnicodeString *__return_storage_ptr__,UnicodeString *desc)

{
  UnicodeString *that;
  UBool UVar1;
  int32_t iVar2;
  ConstChar16Ptr local_20;
  UnicodeString *local_18;
  UnicodeString *desc_local;
  UnicodeString *result;
  
  local_18 = desc;
  desc_local = __return_storage_ptr__;
  ConstChar16Ptr::ConstChar16Ptr
            (&local_20,
             L"<<㙎捩彵㌶ㄲ慓敭慖畬卥扵瑳瑩瑵潩䕮一椶畣㙟ㄳ临卆扵瑳瑩瑵潩䕮一椶畣㙟㈳䴲汵楴汰敩卲扵瑳瑩瑵潩䕮一椶畣㙟ㄳ䴹摯汵獵畓獢楴畴楴湯E㙎捩彵㌶㐲湉整牧污慐瑲畓獢楴畴楴湯E㙎捩彵㌶㘲牆捡楴湯污慐瑲畓獢楴畴楴湯E㙎捩彵㌶㔲扁潳畬整慖畬卥扵瑳瑩瑵潩䕮一椶畣㙟㈳丱浵牥瑡牯畓獢楴畴楴湯E憑￫憫￫懕￫懯￫擉￫擒￫擒￫擒￫擒￫擒￫擀￫撷￫撮￫撥￫撜￫撓￫撊￫撁￫摸￫欣￫欶￫欶￫歓￫武￫殄￫殟￫殺￫毕￫毰￫枟￫梼￫椃￫楀￫楴￫榰￫槬￫樨￫橤￫檝￫㙎捩彵㌶渶浵敢㑲浩汰㌱潔敫䍮湯畳敭䕲一椶畣㙟㘳畮扭牥椴灭ㅬ匴浹潢偬潲楶敤䕲"
            );
  UVar1 = UnicodeString::endsWith(desc,&local_20,2);
  ConstChar16Ptr::~ConstChar16Ptr(&local_20);
  that = local_18;
  if (UVar1 == '\0') {
    UnicodeString::UnicodeString(__return_storage_ptr__,local_18);
  }
  else {
    iVar2 = UnicodeString::length(local_18);
    UnicodeString::UnicodeString(__return_storage_ptr__,that,0,iVar2 + -1);
  }
  return __return_storage_ptr__;
}

Assistant:

static inline UnicodeString fixdesc(const UnicodeString& desc) {
        if (desc.endsWith(LTLT, 2)) {
            UnicodeString result(desc, 0, desc.length()-1);
            return result;
        }
        return desc;
    }